

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void singlevar(LexState *ls,expdesc *var)

{
  FuncState *fs;
  int iVar1;
  TString *n;
  
  n = str_checkname(ls);
  fs = ls->fs;
  iVar1 = singlevaraux(fs,n,var,1);
  if (iVar1 == 8) {
    iVar1 = luaK_stringK(fs,n);
    (var->u).s.info = iVar1;
  }
  return;
}

Assistant:

static void singlevar(LexState*ls,expdesc*var){
TString*varname=str_checkname(ls);
FuncState*fs=ls->fs;
if(singlevaraux(fs,varname,var,1)==VGLOBAL)
var->u.s.info=luaK_stringK(fs,varname);
}